

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-ctest.c
# Opt level: O0

void run_tests(void)

{
  int iVar1;
  long lVar2;
  undefined8 local_70;
  qpdf_data qpdf;
  qpdflogger_handle l3;
  qpdflogger_handle l;
  qpdflogger_handle l2;
  qpdflogger_handle l1;
  char *argv [6];
  undefined8 local_10;
  qpdfjob_handle j;
  
  local_10 = 0;
  l1 = (qpdflogger_handle)anon_var_dwarf_ee;
  argv[0] = "minimal.pdf";
  argv[1] = "a.pdf";
  argv[2] = "--deterministic-id";
  argv[3] = "--progress";
  argv[4] = (char *)0x0;
  local_10 = qpdfjob_init();
  qpdfjob_register_progress_reporter(local_10,custom_progress,"potato");
  iVar1 = qpdfjob_initialize_from_argv(local_10,&l1);
  if (iVar1 != 0) {
    __assert_fail("qpdfjob_initialize_from_argv(j, argv) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdfjob-ctest.c"
                  ,0x34,"void run_tests()");
  }
  iVar1 = qpdfjob_run(local_10);
  if (iVar1 != 0) {
    __assert_fail("qpdfjob_run(j) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdfjob-ctest.c"
                  ,0x35,"void run_tests()");
  }
  qpdfjob_cleanup(&local_10);
  printf("argv test passed\n");
  iVar1 = qpdfjob_run_from_json
                    (
                    "{\n  \"inputFile\": \"20-pages.pdf\",\n  \"password\": \"user\",\n  \"outputFile\": \"b.pdf\",\n  \"staticId\": \"\",\n  \"decrypt\": \"\",\n  \"objectStreams\": \"generate\"\n}"
                    );
  if (iVar1 != 0) {
    __assert_fail("qpdfjob_run_from_json(\"{\\n  \\\"inputFile\\\": \\\"20-pages.pdf\\\",\\n  \\\"password\\\": \\\"user\\\",\\n  \\\"outputFile\\\": \\\"b.pdf\\\",\\n  \\\"staticId\\\": \\\"\\\",\\n  \\\"decrypt\\\": \\\"\\\",\\n  \\\"objectStreams\\\": \\\"generate\\\"\\n}\") == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdfjob-ctest.c"
                  ,0x40,"void run_tests()");
  }
  printf("json test passed\n");
  fflush(_stdout);
  iVar1 = qpdfjob_run_from_json
                    (
                    "{\n  \"inputFile\": \"xref-with-short-size.pdf\",\n  \"outputFile\": \"c.pdf\",\n  \"staticId\": \"\",\n  \"decrypt\": \"\",\n  \"objectStreams\": \"generate\"\n}"
                    );
  if (iVar1 != 3) {
    __assert_fail("qpdfjob_run_from_json(\"{\\n  \\\"inputFile\\\": \\\"xref-with-short-size.pdf\\\",\\n  \\\"outputFile\\\": \\\"c.pdf\\\",\\n  \\\"staticId\\\": \\\"\\\",\\n  \\\"decrypt\\\": \\\"\\\",\\n  \\\"objectStreams\\\": \\\"generate\\\"\\n}\") == 3"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdfjob-ctest.c"
                  ,0x4a,"void run_tests()");
  }
  printf("json warn test passed\n");
  fflush(_stdout);
  local_10 = qpdfjob_init();
  l2 = (qpdflogger_handle)qpdfjob_get_logger(local_10);
  l = (qpdflogger_handle)qpdflogger_default_logger();
  iVar1 = qpdflogger_equal(l2,l);
  if (iVar1 == 0) {
    __assert_fail("qpdflogger_equal(l1, l2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdfjob-ctest.c"
                  ,0x52,"void run_tests()");
  }
  qpdflogger_cleanup(&l2);
  qpdflogger_cleanup(&l);
  l3 = (qpdflogger_handle)qpdflogger_create();
  qpdflogger_set_error(l3,4,custom_log,0);
  qpdfjob_set_logger(local_10,l3);
  qpdf = (qpdf_data)qpdfjob_get_logger(local_10);
  iVar1 = qpdflogger_equal(l3,qpdf);
  if (iVar1 == 0) {
    __assert_fail("qpdflogger_equal(l, l3)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdfjob-ctest.c"
                  ,0x59,"void run_tests()");
  }
  qpdflogger_cleanup(&l3);
  qpdflogger_cleanup(&qpdf);
  qpdfjob_initialize_from_json(local_10,"{\n  \"inputFile\": \"nothing-there.pdf\"\n}");
  iVar1 = qpdfjob_run(local_10);
  if (iVar1 != 2) {
    __assert_fail("qpdfjob_run(j) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdfjob-ctest.c"
                  ,0x60,"void run_tests()");
  }
  qpdfjob_cleanup(&local_10);
  printf("json error test passed\n");
  l1 = (qpdflogger_handle)anon_var_dwarf_ee;
  argv[0] = "minimal.pdf";
  argv[1] = "d.pdf";
  argv[2] = "--deterministic-id";
  argv[3] = "--progress";
  argv[4] = (char *)0x0;
  local_10 = qpdfjob_init();
  iVar1 = qpdfjob_initialize_from_argv(local_10,&l1);
  if (iVar1 == 0) {
    local_70 = qpdfjob_create_qpdf(local_10);
    iVar1 = qpdfjob_write_qpdf(local_10,local_70);
    if (iVar1 != 0) {
      __assert_fail("qpdfjob_write_qpdf(j, qpdf) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdfjob-ctest.c"
                    ,0x6e,"void run_tests()");
    }
    qpdf_cleanup(&local_70);
    qpdfjob_cleanup(&local_10);
    l1 = (qpdflogger_handle)anon_var_dwarf_ee;
    argv[0] = "m.pdf";
    argv[1] = "--check";
    argv[2] = (char *)0x0;
    local_10 = qpdfjob_init();
    iVar1 = qpdfjob_initialize_from_argv(local_10,&l1);
    if (iVar1 == 0) {
      lVar2 = qpdfjob_create_qpdf(local_10);
      if (lVar2 == 0) {
        qpdfjob_cleanup(&local_10);
        printf("qpdfjob_create_qpdf and qpdfjob_write_qpdf test passed\n");
        return;
      }
      __assert_fail("qpdfjob_create_qpdf(j) == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdfjob-ctest.c"
                    ,0x7b,"void run_tests()");
    }
    __assert_fail("qpdfjob_initialize_from_argv(j, argv) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdfjob-ctest.c"
                  ,0x7a,"void run_tests()");
  }
  __assert_fail("qpdfjob_initialize_from_argv(j, argv) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdfjob-ctest.c"
                ,0x6c,"void run_tests()");
}

Assistant:

static void
run_tests()
{
    /* Be sure to use a different output file for each test. */
    qpdfjob_handle j = NULL;

    char const* argv[6];
    argv[0] = "qpdfjob";
    argv[1] = "minimal.pdf";
    argv[2] = "a.pdf";
    argv[3] = "--deterministic-id";
    argv[4] = "--progress";
    argv[5] = NULL;
    j = qpdfjob_init();
    qpdfjob_register_progress_reporter(j, custom_progress, (void*)"potato");
    assert(qpdfjob_initialize_from_argv(j, argv) == 0);
    assert(qpdfjob_run(j) == 0);
    qpdfjob_cleanup(&j);
    printf("argv test passed\n");

    assert(qpdfjob_run_from_json("{\n\
  \"inputFile\": \"20-pages.pdf\",\n\
  \"password\": \"user\",\n\
  \"outputFile\": \"b.pdf\",\n\
  \"staticId\": \"\",\n\
  \"decrypt\": \"\",\n\
  \"objectStreams\": \"generate\"\n\
}") == 0);
    printf("json test passed\n");
    fflush(stdout);

    assert(qpdfjob_run_from_json("{\n\
  \"inputFile\": \"xref-with-short-size.pdf\",\n\
  \"outputFile\": \"c.pdf\",\n\
  \"staticId\": \"\",\n\
  \"decrypt\": \"\",\n\
  \"objectStreams\": \"generate\"\n\
}") == 3);
    printf("json warn test passed\n");
    fflush(stdout);

    /* Also exercise custom logger */
    j = qpdfjob_init();
    qpdflogger_handle l1 = qpdfjob_get_logger(j);
    qpdflogger_handle l2 = qpdflogger_default_logger();
    assert(qpdflogger_equal(l1, l2));
    qpdflogger_cleanup(&l1);
    qpdflogger_cleanup(&l2);
    qpdflogger_handle l = qpdflogger_create();
    qpdflogger_set_error(l, qpdf_log_dest_custom, custom_log, NULL);
    qpdfjob_set_logger(j, l);
    qpdflogger_handle l3 = qpdfjob_get_logger(j);
    assert(qpdflogger_equal(l, l3));
    qpdflogger_cleanup(&l);
    qpdflogger_cleanup(&l3);

    qpdfjob_initialize_from_json(j, "{\n\
  \"inputFile\": \"nothing-there.pdf\"\n\
}");
    assert(qpdfjob_run(j) == 2);
    qpdfjob_cleanup(&j);
    printf("json error test passed\n");

    /* qpdfjob_create_qpdf and qpdfjob_write_qpdf test */
    argv[0] = "qpdfjob";
    argv[1] = "minimal.pdf";
    argv[2] = "d.pdf";
    argv[3] = "--deterministic-id";
    argv[4] = "--progress";
    argv[5] = NULL;
    j = qpdfjob_init();
    assert(qpdfjob_initialize_from_argv(j, argv) == 0);
    qpdf_data qpdf = qpdfjob_create_qpdf(j);
    assert(qpdfjob_write_qpdf(j, qpdf) == 0);
    qpdf_cleanup(&qpdf);
    qpdfjob_cleanup(&j);

    /* Try to open a missing file to test case of QPDFJob::createQPDF returning
     * nullptr.
     */
    argv[0] = "qpdfjob";
    argv[1] = "m.pdf";
    argv[2] = "--check";
    argv[3] = NULL;
    j = qpdfjob_init();
    assert(qpdfjob_initialize_from_argv(j, argv) == 0);
    assert(qpdfjob_create_qpdf(j) == NULL);
    qpdfjob_cleanup(&j);
    printf("qpdfjob_create_qpdf and qpdfjob_write_qpdf test passed\n");
}